

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

string * __thiscall blc::tools::VFile::getCache_abi_cxx11_(VFile *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x218));
  return in_RDI;
}

Assistant:

std::string blc::tools::VFile::getCache() const {
	return (this->_cache);
}